

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O2

int dwarf_get_ranges_b(Dwarf_Debug dbg,Dwarf_Off rangesoffset,Dwarf_Die die,Dwarf_Off *actual_offset
                      ,Dwarf_Ranges **rangesbuf,Dwarf_Signed *listlen,Dwarf_Unsigned *bytecount,
                      Dwarf_Error *error)

{
  byte bVar1;
  Dwarf_CU_Context_conflict pDVar2;
  Dwarf_Addr DVar3;
  undefined4 uVar4;
  Dwarf_Off *pDVar5;
  int iVar6;
  Dwarf_Small *pDVar7;
  ranges_entry *prVar8;
  Dwarf_Ranges *pDVar9;
  uint uVar10;
  char *pcVar11;
  Dwarf_Unsigned count;
  Dwarf_Signed DVar12;
  Dwarf_Debug pDVar13;
  Dwarf_Addr *addr_out;
  Dwarf_Small *pDVar14;
  ranges_entry *local_e0;
  Dwarf_Half offset_size;
  Dwarf_Half die_version;
  ranges_entry *local_d0;
  Dwarf_Small *local_c8;
  Dwarf_Small *local_c0;
  ulong local_b8;
  Dwarf_Error localerror;
  Dwarf_Small *local_a8;
  Dwarf_Small *local_a0;
  Dwarf_Addr local_98;
  Dwarf_Small *local_90;
  Dwarf_Debug local_88;
  Dwarf_Off *local_80;
  ranges_entry *local_78;
  Dwarf_Small *local_70;
  ulong local_68;
  Dwarf_Ranges **local_60;
  Dwarf_Unsigned *local_58;
  dwarfstring m;
  
  localerror = (Dwarf_Error)0x0;
  die_version = 3;
  offset_size = 4;
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    pcVar11 = 
    "DW_DLE_DBG_NULL: dbg argument to dwarf_get_ranges_b()either null or it containsa stale Dwarf_Debug pointer"
    ;
    DVar12 = 0x51;
    dbg = (Dwarf_Debug)0x0;
LAB_0017164f:
    _dwarf_error_string(dbg,error,DVar12,pcVar11);
    return 1;
  }
  local_60 = rangesbuf;
  local_58 = (Dwarf_Unsigned *)listlen;
  if (die == (Dwarf_Die)0x0) {
    pDVar7 = &dbg->de_pointer_size;
    local_c8 = (Dwarf_Small *)0x0;
  }
  else {
    iVar6 = dwarf_get_version_of_die(die,&die_version,&offset_size);
    if ((iVar6 == 1) || (pDVar2 = die->di_cu_context, pDVar2 == (Dwarf_CU_Context_conflict)0x0)) {
      DVar12 = 0x68;
      goto LAB_00171676;
    }
    if (pDVar2->cc_unit_type == 4) {
      local_c8 = (Dwarf_Small *)0x0;
    }
    else {
      local_c8 = (Dwarf_Small *)pDVar2->cc_ranges_base;
    }
    rangesoffset = (Dwarf_Off)(local_c8 + rangesoffset);
    pDVar7 = &pDVar2->cc_address_size;
  }
  bVar1 = *pDVar7;
  iVar6 = _dwarf_load_section(dbg,&dbg->de_debug_ranges,error);
  if (iVar6 == 1) {
    return 1;
  }
  pDVar13 = dbg;
  if (iVar6 == -1) {
    pDVar13 = (dbg->de_tied_data).td_tied_object;
    if (pDVar13 == (Dwarf_Debug)0x0) {
      return -1;
    }
    iVar6 = _dwarf_load_section(pDVar13,&pDVar13->de_debug_ranges,&localerror);
    if (iVar6 == -1) {
      return -1;
    }
    if (iVar6 == 1) {
      _dwarf_error_mv_s_to_t(pDVar13,&localerror,dbg,error);
      return 1;
    }
  }
  pDVar14 = local_c8;
  pDVar7 = (Dwarf_Small *)(pDVar13->de_debug_ranges).dss_size;
  if (pDVar7 <= rangesoffset) {
    return -1;
  }
  if (pDVar7 <= local_c8) {
    dwarfstring_constructor(&m);
    dwarfstring_append_printf_u
              (&m,"DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges base is 0x%lx ",(dwarfstring_u)pDVar14);
    dwarfstring_append_printf_u
              (&m," and section size is 0x%lx.",(pDVar13->de_debug_ranges).dss_size);
LAB_001718f5:
    pcVar11 = dwarfstring_string(&m);
    _dwarf_error_string(dbg,error,0xce,pcVar11);
    dwarfstring_destructor(&m);
    return 1;
  }
  pDVar14 = (pDVar13->de_debug_ranges).dss_data;
  local_c8 = pDVar7 + (long)pDVar14;
  pDVar14 = (Dwarf_Small *)(rangesoffset + (long)pDVar14);
  local_98 = 0xffffffffffffffff;
  if (bVar1 != 8) {
    local_98 = 0xffffffff;
  }
  local_b8 = (ulong)((uint)bVar1 * 2);
  count = 0;
  local_e0 = (ranges_entry *)0x0;
  prVar8 = (ranges_entry *)0x0;
  local_c0 = (Dwarf_Small *)rangesoffset;
  local_a8 = pDVar14;
  local_90 = pDVar7;
  local_88 = pDVar13;
  local_80 = actual_offset;
  while (pDVar13 = local_88, pDVar7 = local_c8, local_90 != (Dwarf_Small *)rangesoffset) {
    if (local_c8 < pDVar14) {
      free_allocated_ranges(local_e0);
      dwarfstring_constructor(&m);
      dwarfstring_append(&m,
                         "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  ranges pointer ran off the end of the  section"
                        );
      goto LAB_001718f5;
    }
    local_d0 = local_e0;
    local_78 = prVar8;
    local_70 = (Dwarf_Small *)rangesoffset;
    local_68 = count;
    prVar8 = (ranges_entry *)calloc(1,0x20);
    pDVar7 = local_c8;
    if (prVar8 == (ranges_entry *)0x0) {
      free_allocated_ranges(local_d0);
      DVar12 = 0xd0;
      goto LAB_00171676;
    }
    local_a0 = pDVar14 + local_b8;
    if (local_c8 < local_a0) {
      free(prVar8);
      free_allocated_ranges(local_d0);
      pcVar11 = 
      "DW_DLE_DEBUG_RANGES_OFFSET_BAD:  Not at the end of the ranges section  but there is not enough room in the section  for the next ranges entry"
      ;
      DVar12 = 0xce;
      goto LAB_0017164f;
    }
    iVar6 = read_unaligned_addr_check
                      (pDVar13,&(prVar8->cur).dwr_addr1,pDVar14,(uint)bVar1,error,local_c8);
    if (iVar6 != 0) {
LAB_0017192a:
      free(prVar8);
      free_allocated_ranges(local_d0);
      return 1;
    }
    addr_out = &(prVar8->cur).dwr_addr2;
    iVar6 = read_unaligned_addr_check(pDVar13,addr_out,pDVar14 + bVar1,(uint)bVar1,error,pDVar7);
    if (iVar6 != 0) goto LAB_0017192a;
    local_e0 = prVar8;
    if (local_d0 != (ranges_entry *)0x0) {
      local_78->next = prVar8;
      local_e0 = local_d0;
    }
    DVar3 = (prVar8->cur).dwr_addr1;
    if ((DVar3 == 0) && (*addr_out == 0)) {
      (prVar8->cur).dwr_type = DW_RANGES_END;
      count = (Dwarf_Unsigned)((int)local_68 + 1);
      pDVar7 = local_a0;
      break;
    }
    pDVar14 = pDVar14 + bVar1 + bVar1;
    (prVar8->cur).dwr_type = (uint)(DVar3 == local_98);
    count = (Dwarf_Unsigned)((int)local_68 + 1);
    rangesoffset = (Dwarf_Off)(local_70 + local_b8);
  }
  pDVar5 = local_80;
  pDVar14 = local_c0;
  pDVar9 = (Dwarf_Ranges *)_dwarf_get_alloc(dbg,'\x1d',count);
  if (pDVar9 != (Dwarf_Ranges *)0x0) {
    *local_60 = pDVar9;
    *local_58 = count;
    prVar8 = local_e0;
    for (uVar10 = 0; (prVar8 != (ranges_entry *)0x0 && (uVar10 < (uint)count)); uVar10 = uVar10 + 1)
    {
      uVar4 = *(undefined4 *)&(prVar8->cur).field_0x14;
      pDVar9->dwr_type = (prVar8->cur).dwr_type;
      *(undefined4 *)&pDVar9->field_0x14 = uVar4;
      DVar3 = (prVar8->cur).dwr_addr2;
      pDVar9->dwr_addr1 = (prVar8->cur).dwr_addr1;
      pDVar9->dwr_addr2 = DVar3;
      pDVar9 = pDVar9 + 1;
      prVar8 = prVar8->next;
    }
    free_allocated_ranges(local_e0);
    if (pDVar5 != (Dwarf_Off *)0x0) {
      *pDVar5 = (Dwarf_Off)pDVar14;
    }
    if (bytecount != (Dwarf_Unsigned *)0x0) {
      *bytecount = (long)pDVar7 - (long)local_a8;
      return 0;
    }
    return 0;
  }
  free_allocated_ranges(local_e0);
  DVar12 = 0xd0;
LAB_00171676:
  _dwarf_error(dbg,error,DVar12);
  return 1;
}

Assistant:

int dwarf_get_ranges_b(Dwarf_Debug dbg,
    Dwarf_Off rangesoffset,
    Dwarf_Die die,
    Dwarf_Off *actual_offset /* in .debug_ranges */,
    Dwarf_Ranges ** rangesbuf,
    Dwarf_Signed * listlen,
    Dwarf_Unsigned * bytecount,
    Dwarf_Error * error)
{
    Dwarf_Small *rangeptr = 0;
    Dwarf_Small *beginrangeptr = 0;
    Dwarf_Small *section_end = 0;
    unsigned entry_count = 0;
    struct ranges_entry *base = 0;
    struct ranges_entry *last = 0;
    struct ranges_entry *curre = 0;
    Dwarf_Ranges * ranges_data_out = 0;
    unsigned copyindex = 0;
    Dwarf_Half address_size = 0;
    int res = DW_DLV_ERROR;
    Dwarf_Unsigned ranges_base = 0;
    Dwarf_Debug    localdbg = dbg;
    Dwarf_Error    localerror = 0;

    /* default for dwarf_get_ranges() */
    Dwarf_Half     die_version = 3;

    Dwarf_Half offset_size= 4;
    Dwarf_CU_Context cucontext = 0;

    CHECK_DBG(dbg,error,"dwarf_get_ranges_b()");
    address_size = localdbg->de_pointer_size; /* default  */
    if (die) {
        /*  printing by raw offset from DW_AT_ranges attribute.
            If we wind up using the tied file the die_version
            had better match! It cannot be other than a match.
            Can return DW_DLV_ERROR, not DW_DLV_NO_ENTRY.
            Add err code if error.  Version comes from the
            cu context, not the DIE itself. */
        res = dwarf_get_version_of_die(die,&die_version,
            &offset_size);
        if (res == DW_DLV_ERROR) {
            _dwarf_error(dbg, error, DW_DLE_DIE_NO_CU_CONTEXT);
            return DW_DLV_ERROR;
        }
        if (!die->di_cu_context) {
            _dwarf_error(dbg, error, DW_DLE_DIE_NO_CU_CONTEXT);
            return DW_DLV_ERROR;
        }
        cucontext = die->di_cu_context;
        /*  The DW4 ranges base was never used in GNU
            but did get emitted, the note says, but
            the note is probably obsolete (so, now wrong).
            http://llvm.1065342.n5.nabble.com/DebugInfo\
            -DW-AT-GNU-ranges-base-in-non-fission-\
            td64194.html
            HOWEVER: in dw4 GNU fission extension
            it is used and matters.
            */
        /*  ranges_base was merged from tied context.
            Otherwise it is zero. But not if
            the current die is the skeleton */
        if (cucontext->cc_unit_type != DW_UT_skeleton) {
            ranges_base = cucontext->cc_ranges_base;
        }
        rangesoffset += ranges_base;
        address_size = cucontext->cc_address_size;
    } else {
        /*  Printing by raw offset
            The caller will use the bytecount to
            increment to the next part of .debug_ranges
            and will call again with the next offset */
    }

    localdbg = dbg;
    res = _dwarf_load_section(localdbg, &localdbg->de_debug_ranges,
        error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    if (res == DW_DLV_NO_ENTRY) {
        /* data is in a.out, not dwp */
        localdbg = dbg->de_tied_data.td_tied_object;
        if (!localdbg) {
            return DW_DLV_NO_ENTRY;
        }
        res = _dwarf_load_section(localdbg,
            &localdbg->de_debug_ranges, &localerror);
        if (res == DW_DLV_ERROR) {
            _dwarf_error_mv_s_to_t(localdbg,&localerror,dbg,error);
            return res;
        }
        if (res == DW_DLV_NO_ENTRY) {
            return res;
        }
    }

    /*  Be safe in case adding rangesoffset and rangebase
        overflows. */
    if (rangesoffset  >= localdbg->de_debug_ranges.dss_size) {
        /* Documented behavior in libdwarf2.1.mm */
        return DW_DLV_NO_ENTRY;
    }
    if (ranges_base >= localdbg->de_debug_ranges.dss_size) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
            " ranges base is 0x%lx ",ranges_base);
        dwarfstring_append_printf_u(&m,
            " and section size is 0x%lx.",
            localdbg->de_debug_ranges.dss_size);
        _dwarf_error_string(dbg, error,
            DW_DLE_DEBUG_RANGES_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }
    if (rangesoffset >= localdbg->de_debug_ranges.dss_size) {
        dwarfstring m;

        dwarfstring_constructor(&m);
        dwarfstring_append_printf_u(&m,
            "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
            " ranges base+offset  is 0x%lx ",
            ranges_base+rangesoffset);
        dwarfstring_append_printf_u(&m,
            " and section size is 0x%lx.",
            localdbg->de_debug_ranges.dss_size);
        _dwarf_error_string(dbg, error,
            DW_DLE_DEBUG_RANGES_OFFSET_BAD,
            dwarfstring_string(&m));
        dwarfstring_destructor(&m);
        return DW_DLV_ERROR;
    }

    /*  tied address_size must match the dwo address_size */
    section_end = localdbg->de_debug_ranges.dss_data +
        localdbg->de_debug_ranges.dss_size;
    rangeptr = localdbg->de_debug_ranges.dss_data;
#if 0
    if (!rangeslocal) {
        /* printing ranges where range source is dwp,
            here we just assume present. */
    }
#endif
    rangeptr += rangesoffset;
    beginrangeptr = rangeptr;

    for (;;) {
        struct ranges_entry * re = 0;

        if (rangeptr == section_end) {
            break;
        }
        if (rangeptr  > section_end) {
            dwarfstring m;

            free_allocated_ranges(base);
            dwarfstring_constructor(&m);
            dwarfstring_append(&m,
                "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
                " ranges pointer ran off the end "
                "of the  section");
            _dwarf_error_string(dbg, error,
                DW_DLE_DEBUG_RANGES_OFFSET_BAD,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        re = calloc(1, sizeof(struct ranges_entry));
        if (!re) {
            free_allocated_ranges(base);
            _dwarf_error(dbg, error, DW_DLE_DEBUG_RANGES_OUT_OF_MEM);
            return DW_DLV_ERROR;
        }
        if ((rangeptr + (2*address_size)) > section_end) {
            free(re);
            free_allocated_ranges(base);
            _dwarf_error_string(dbg, error,
                DW_DLE_DEBUG_RANGES_OFFSET_BAD,
                "DW_DLE_DEBUG_RANGES_OFFSET_BAD: "
                " Not at the end of the ranges section "
                " but there is not enough room in the section "
                " for the next ranges entry");
            return  DW_DLV_ERROR;
        }
        entry_count++;
        res = read_unaligned_addr_check(localdbg,&re->cur.dwr_addr1,
            rangeptr, address_size,error,section_end);
        if (res != DW_DLV_OK) {
            free(re);
            free_allocated_ranges(base);
            return res;
        }
        rangeptr +=  address_size;
        res = read_unaligned_addr_check(localdbg,&re->cur.dwr_addr2,
            rangeptr, address_size,error,section_end);
        if (res != DW_DLV_OK) {
            free(re);
            free_allocated_ranges(base);
            return res;
        }
        rangeptr +=  address_size;
        if (!base) {
            base = re;
            last = re;
        } else {
            last->next = re;
            last = re;
        }
        if (re->cur.dwr_addr1 == 0 && re->cur.dwr_addr2 == 0) {
            re->cur.dwr_type =  DW_RANGES_END;
            break;
        } else if (re->cur.dwr_addr1 == MAX_ADDR) {
            re->cur.dwr_type =  DW_RANGES_ADDRESS_SELECTION;
        } else {
            re->cur.dwr_type =  DW_RANGES_ENTRY;
        }
    }

    /* We return ranges on dbg, so use that to allocate. */
    ranges_data_out =   (Dwarf_Ranges *)
        _dwarf_get_alloc(dbg,DW_DLA_RANGES,entry_count);
    if (!ranges_data_out) {
        /* Error, apply to original, not local dbg. */
        free_allocated_ranges(base);
        _dwarf_error(dbg, error, DW_DLE_DEBUG_RANGES_OUT_OF_MEM);
        return DW_DLV_ERROR;
    }
    curre = base;
    *rangesbuf = ranges_data_out;
    *listlen = entry_count;
    for (copyindex = 0; curre && (copyindex < entry_count);
        ++copyindex,++ranges_data_out,curre=curre->next) {
        *ranges_data_out = curre->cur;
    }
    /* ASSERT: curre == NULL */
    free_allocated_ranges(base);
    base = 0;
    /* Callers will often not care about the bytes used. */
    if (actual_offset) {
        *actual_offset = rangesoffset;
    }
    if (bytecount) {
        *bytecount = rangeptr - beginrangeptr;
    }
    return DW_DLV_OK;
}